

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

int __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::kill
          (holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this,
          __pid_t __pid,int __sig)

{
  int extraout_EAX;
  
  cs::
  allocator_type<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
  ::free((allocator_type<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *)holder<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>::allocator,this);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}